

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

bool __thiscall asmjit::v1_14::String::equals(String *this,char *other,size_t size)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  String *__s1;
  bool bVar3;
  
  __n = (size_t)(byte)*this;
  if (__n < 0x1f) {
    __s1 = this + 1;
  }
  else {
    __n = *(size_t *)(this + 8);
    __s1 = *(String **)(this + 0x18);
  }
  if (size == 0xffffffffffffffff) {
    if (__n == 0) {
      __n = 0;
    }
    else {
      sVar2 = 0;
      do {
        if (__s1[sVar2] != *(String *)(other + sVar2)) {
          return false;
        }
        if (*(String *)(other + sVar2) == (String)0x0) {
          return false;
        }
        sVar2 = sVar2 + 1;
      } while (__n != sVar2);
    }
    bVar3 = other[__n] == '\0';
  }
  else if (__n == size) {
    iVar1 = bcmp(__s1,other,__n);
    bVar3 = iVar1 == 0;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool String::equals(const char* other, size_t size) const noexcept {
  const char* aData = data();
  const char* bData = other;

  size_t aSize = this->size();
  size_t bSize = size;

  if (bSize == SIZE_MAX) {
    size_t i;
    for (i = 0; i < aSize; i++)
      if (aData[i] != bData[i] || bData[i] == 0)
        return false;
    return bData[i] == 0;
  }
  else {
    if (aSize != bSize)
      return false;
    return ::memcmp(aData, bData, aSize) == 0;
  }
}